

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O1

void __thiscall Parse::SMTLIB2::readAssert(SMTLIB2 *this,LExpr *body)

{
  List<Kernel::Unit_*> *pLVar1;
  long lVar2;
  bool bVar3;
  Unit *this_00;
  List<Kernel::Unit_*> *pLVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  SplitSet **ppSVar8;
  long *plVar9;
  FIFO *pFVar10;
  Formula *fla;
  ParseResult res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  long local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  Formula *local_130;
  SplitSet **local_128;
  long lStack_120;
  SplitSet *local_118;
  void *pvStack_110;
  void *local_108;
  float fStack_100;
  float fStack_fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  Inference local_98;
  ParseResult local_60;
  
  this->_nextVar = 0;
  parseTermOrFormula(&local_60,this,body,false);
  bVar3 = ParseResult::asFormula(&local_60,&local_130);
  if (bVar3) {
    this_00 = (Unit *)::operator_new(0x48,8);
    local_f8._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference((Inference *)&local_128,(FromInput *)&local_f8);
    local_98._ptr2 = local_108;
    local_98.th_ancestors = fStack_100;
    local_98.all_ancestors = fStack_fc;
    local_98._splits = local_118;
    local_98._ptr1 = pvStack_110;
    local_98._0_8_ = local_128;
    local_98._8_8_ = lStack_120;
    Kernel::Unit::Unit(this_00,FORMULA,&local_98);
    *(Formula **)(this_00 + 1) = local_130;
    *(undefined8 *)&this_00[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_00);
    pLVar4 = (List<Kernel::Unit_*> *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar4->_head = this_00;
    pLVar4->_tail = (List<Kernel::Unit_*> *)0x0;
    pLVar1 = (this->_formulas)._last;
    pFVar10 = (FIFO *)&pLVar1->_tail;
    if (pLVar1 == (List<Kernel::Unit_*> *)0x0) {
      pFVar10 = &this->_formulas;
    }
    pFVar10->_first = pLVar4;
    (this->_formulas)._last = pLVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.label._M_dataplus._M_p != &local_60.label.field_2) {
      operator_delete(local_60.label._M_dataplus._M_p,
                      local_60.label.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_b8,body,true);
  std::operator+(&local_f8,"Asserted expression of non-boolean sort ",&local_b8);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_128 = (SplitSet **)*plVar6;
  ppSVar8 = (SplitSet **)(plVar6 + 2);
  if (local_128 == ppSVar8) {
    local_118 = *ppSVar8;
    pvStack_110 = (void *)plVar6[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *ppSVar8;
  }
  lStack_120 = plVar6[1];
  *plVar6 = (long)ppSVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_d8,this->_topLevelExpr,true);
  std::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  plVar6 = (long *)*plVar7;
  plVar9 = plVar7 + 2;
  if (plVar6 == plVar9) {
    local_140 = *plVar9;
    uStack_138 = (undefined4)plVar7[3];
    uStack_134 = *(undefined4 *)((long)plVar7 + 0x1c);
    plVar6 = &local_140;
  }
  else {
    local_140 = *plVar9;
  }
  lVar2 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  *puVar5 = &PTR_cry_00b69f40;
  puVar5[1] = puVar5 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 1),plVar6,lVar2 + (long)plVar6);
  *puVar5 = &PTR_cry_00b6a028;
  *(undefined4 *)(puVar5 + 5) = 0;
  puVar5[6] = puVar5 + 8;
  puVar5[7] = 0;
  *(undefined1 *)(puVar5 + 8) = 0;
  __cxa_throw(puVar5,&::Lib::UserErrorException::typeinfo,
              ::Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readAssert(LExpr* body)
{
  _nextVar = 0;
  ASS(_scopes.isEmpty());

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  Formula* fla;
  if (!res.asFormula(fla)) {
    USER_ERROR_EXPR("Asserted expression of non-boolean sort "+body->toString());
  }

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));
  _formulas.pushBack(fu);
}